

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O0

void __thiscall
Js::JavascriptSet::ExtractSnapObjectDataInto
          (JavascriptSet *this,SnapObject *objData,SlabAllocator *alloc)

{
  bool bVar1;
  int iVar2;
  MapOrSetDataNode<void_*> *pMVar3;
  void **ppvVar4;
  Iterator iter;
  SnapSetInfo *ssi;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  JavascriptSet *this_local;
  
  iter.current.ptr =
       (MapOrSetDataNode<void_*> *)
       TTD::SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapSetInfo>(alloc);
  *(uint32 *)&((iter.current.ptr)->next).ptr = 0;
  iVar2 = Size(this);
  if (iVar2 == 0) {
    ((iter.current.ptr)->prev).ptr = (MapOrSetDataNode<void_*> *)0x0;
  }
  else {
    iVar2 = Size(this);
    pMVar3 = (MapOrSetDataNode<void_*> *)
             TTD::SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(long)iVar2);
    ((iter.current.ptr)->prev).ptr = pMVar3;
    GetIterator((JavascriptSet *)&stack0xffffffffffffffc8);
    while (bVar1 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)&stack0xffffffffffffffc8),
          bVar1) {
      ppvVar4 = MapOrSetDataList<void_*>::Iterator::Current((Iterator *)&stack0xffffffffffffffc8);
      (&(((iter.current.ptr)->prev).ptr)->next)[*(uint *)&((iter.current.ptr)->next).ptr].ptr =
           (MapOrSetDataNode<void_*> *)*ppvVar4;
      *(int *)&((iter.current.ptr)->next).ptr = *(int *)&((iter.current.ptr)->next).ptr + 1;
    }
  }
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapSetInfo*,(TTD::NSSnapObjects::SnapObjectType)25>
            (objData,(SnapSetInfo *)iter.current.ptr);
  return;
}

Assistant:

void JavascriptSet::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
{
    TTD::NSSnapObjects::SnapSetInfo* ssi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapSetInfo>();
    ssi->SetSize = 0;

    if(this->Size() == 0)
    {
        ssi->SetValueArray = nullptr;
    }
    else
    {
        ssi->SetValueArray = alloc.SlabAllocateArray<TTD::TTDVar>(this->Size());

        auto iter = this->GetIterator();
        while(iter.Next())
        {
            ssi->SetValueArray[ssi->SetSize] = iter.Current();
            ssi->SetSize++;
        }
    }

    TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapSetInfo*, TTD::NSSnapObjects::SnapObjectType::SnapSetObject>(objData, ssi);
}